

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeEDSK.cpp
# Opt level: O1

int __thiscall
FormatTypeEDSK::LoadDisk
          (FormatTypeEDSK *this,uchar *buffer,size_t size,IDisk **created_disk,
          ILoadingProgress *loading_progress)

{
  byte bVar1;
  byte bVar2;
  Track *pTVar3;
  ushort uVar4;
  bool bVar5;
  byte bVar6;
  uint uVar7;
  IDisk *this_00;
  Track *pTVar8;
  MFMTrack *pMVar9;
  byte *pbVar10;
  Sector *pSVar11;
  ulong uVar12;
  ulong *puVar13;
  undefined8 *puVar14;
  void *pvVar15;
  byte bVar16;
  long lVar17;
  int *piVar18;
  int iVar19;
  ulong uVar20;
  byte *pbVar21;
  ulong uVar22;
  ulong uVar23;
  Track **ppTVar24;
  uchar *puVar25;
  int iVar26;
  Side *pSVar27;
  Track trk;
  int local_c0;
  ulong local_b0;
  void *local_98;
  Track local_58;
  
  iVar19 = -1;
  if (*(long *)buffer == 0x4445444e45545845) {
    this_00 = (IDisk *)operator_new(0x68);
    IDisk::IDisk(this_00);
    bVar1 = buffer[0x30];
    bVar2 = buffer[0x31];
    bVar6 = bVar2;
    if (1 < bVar2) {
      bVar6 = 2;
    }
    this_00->nb_sides_ = bVar6;
    if (bVar2 != 0) {
      uVar12 = (ulong)((uint)bVar1 * 8) * 5;
      uVar7 = 0x2a;
      if (0x2a < bVar1) {
        uVar7 = (uint)bVar1;
      }
      bVar16 = 2;
      if (bVar2 < 2) {
        bVar16 = bVar2;
      }
      pbVar21 = buffer + 0x34;
      uVar20 = 0;
      do {
        this->side_[uVar20].nb_tracks = bVar1;
        this_00->side_[uVar20].nb_tracks = (uint)bVar1;
        pTVar8 = (Track *)operator_new__(uVar12);
        this->side_[uVar20].tracks = pTVar8;
        pMVar9 = (MFMTrack *)operator_new__((ulong)(uVar7 << 5));
        this_00->side_[uVar20].tracks = pMVar9;
        memset(pMVar9,0,(ulong)bVar1 << 5);
        memset(pTVar8,0,uVar12);
        if (bVar1 != 0) {
          lVar17 = 0;
          pbVar10 = pbVar21;
          do {
            *(uint *)((long)&pTVar8->track_size + lVar17) = (uint)*pbVar10 << 8;
            lVar17 = lVar17 + 0x28;
            pbVar10 = pbVar10 + bVar16;
          } while ((ulong)((uint)bVar1 * 8) * 5 != lVar17);
        }
        uVar20 = uVar20 + 1;
        pbVar21 = pbVar21 + 1;
      } while (uVar20 != bVar6);
    }
    if (bVar1 == 0) {
      uVar7 = 0x100;
    }
    else {
      uVar12 = 0;
      local_b0 = 0x100;
      do {
        if (this_00->nb_sides_ != '\0') {
          uVar23 = 0;
          uVar20 = local_b0;
          do {
            pTVar3 = this->side_[uVar23].tracks;
            pTVar8 = pTVar3 + uVar12;
            if (pTVar8->track_size < 0x101) {
              local_b0 = (ulong)(uint)((int)uVar20 + pTVar8->track_size);
              pTVar8->formatted = false;
              bVar5 = true;
            }
            else {
              pTVar8->formatted = true;
              local_b0 = (ulong)((int)uVar20 + 0x100);
              if (*(short *)(buffer + uVar20 + 8) == 0x6f66 &&
                  *(long *)(buffer + uVar20) == 0x6e492d6b63617254) {
                puVar25 = buffer + uVar20;
                bVar2 = puVar25[0x14];
                ppTVar24 = &this->side_[uVar23].tracks;
                pTVar3[uVar12].sz = bVar2;
                pTVar3[uVar12].sector_size = 0x80 << (bVar2 & 0x1f);
                bVar2 = puVar25[0x15];
                pTVar3[uVar12].nb_sector = (uint)bVar2;
                pTVar3[uVar12].gap3 = puVar25[0x16];
                pTVar3[uVar12].gap3_filler = 'N';
                pSVar11 = (Sector *)operator_new__((ulong)bVar2 * 0x1d0);
                pTVar3[uVar12].sectors = pSVar11;
                pTVar8 = *ppTVar24;
                if (pTVar8[uVar12].nb_sector == 0) {
                  uVar7 = 0;
                  local_c0 = 0x100;
                }
                else {
                  local_c0 = 0x100;
                  iVar19 = 0x18;
                  lVar17 = 0;
                  uVar20 = 0;
                  uVar7 = 0;
                  iVar26 = 0;
                  do {
                    memset((pTVar8[uVar12].sectors)->mfm_chrn + lVar17 + -0x18,0,0x1d0);
                    if (0x100U - iVar19 < iVar26 * 8 + 8U) {
                      puVar25 = buffer + local_b0;
                      local_b0 = (ulong)((int)local_b0 + 0x100);
                      local_c0 = local_c0 + 0x100;
                      iVar19 = 0;
                      iVar26 = 0;
                    }
                    pSVar11 = (*ppTVar24)[uVar12].sectors;
                    pSVar11->mfm_chrn[lVar17 + -0x18] = puVar25[(uint)(iVar19 + iVar26 * 8)];
                    pSVar11->mfm_chrn[lVar17 + -0x17] = puVar25[(uint)(iVar19 + 1 + iVar26 * 8)];
                    pSVar11->mfm_chrn[lVar17 + -0x16] = puVar25[(uint)(iVar19 + 2 + iVar26 * 8)];
                    pSVar11->mfm_chrn[lVar17 + -0x15] = puVar25[(uint)(iVar19 + 3 + iVar26 * 8)];
                    pSVar11->mfm_chrn[lVar17 + -0x14] = puVar25[(uint)(iVar19 + 4 + iVar26 * 8)];
                    pSVar11->mfm_chrn[lVar17 + -0x13] = puVar25[(uint)(iVar19 + 5 + iVar26 * 8)];
                    bVar2 = puVar25[(uint)(iVar19 + 6 + iVar26 * 8)];
                    *(ushort *)(pSVar11->mfm_chrn + lVar17 + -0x12) = (ushort)bVar2;
                    uVar4 = CONCAT11(puVar25[iVar19 + iVar26 * 8 + 7],bVar2);
                    *(ushort *)(pSVar11->mfm_chrn + lVar17 + -0x12) = uVar4;
                    uVar7 = uVar7 + uVar4;
                    iVar26 = iVar26 + 1;
                    uVar20 = uVar20 + 1;
                    pTVar8 = *ppTVar24;
                    lVar17 = lVar17 + 0x1d0;
                  } while (uVar20 < pTVar8[uVar12].nb_sector);
                }
                piVar18 = &pTVar8[uVar12].track_size;
                if ((uVar7 < 0xff01) || (uVar7 <= (uint)(*piVar18 - local_c0))) {
                  local_98 = operator_new__((ulong)(uint)(*piVar18 - local_c0));
                  memcpy(local_98,buffer + local_b0,(ulong)(uint)(*piVar18 - local_c0));
                  local_c0 = *piVar18 - local_c0;
                }
                else {
                  uVar7 = uVar7 + 0xff & 0xffffff00;
                  *piVar18 = uVar7;
                  local_98 = operator_new__((long)(int)uVar7);
                  memcpy(local_98,buffer + local_b0,(long)*piVar18);
                  local_c0 = *piVar18;
                }
                pTVar8 = *ppTVar24;
                if (pTVar8[uVar12].nb_sector != 0) {
                  lVar17 = 0;
                  uVar20 = 0;
                  uVar7 = 0;
                  do {
                    uVar22 = (ulong)*(ushort *)((pTVar8[uVar12].sectors)->mfm_chrn + lVar17 + -0x12)
                    ;
                    if (uVar22 == 0) {
                      puVar25 = (pTVar8[uVar12].sectors)->mfm_chrn + lVar17 + -8;
                      puVar25[0] = '\0';
                      puVar25[1] = '\0';
                      puVar25[2] = '\0';
                      puVar25[3] = '\0';
                      puVar25[4] = '\0';
                      puVar25[5] = '\0';
                      puVar25[6] = '\0';
                      puVar25[7] = '\0';
                    }
                    else {
                      pvVar15 = operator_new__(uVar22);
                      pSVar11 = pTVar8[uVar12].sectors;
                      *(void **)(pSVar11->mfm_chrn + lVar17 + -8) = pvVar15;
                      memcpy(pvVar15,(void *)((ulong)uVar7 + (long)local_98),
                             (ulong)*(ushort *)(pSVar11->mfm_chrn + lVar17 + -0x12));
                      uVar7 = uVar7 + *(ushort *)
                                       (((*ppTVar24)[uVar12].sectors)->mfm_chrn + lVar17 + -0x12);
                    }
                    uVar20 = uVar20 + 1;
                    pTVar8 = *ppTVar24;
                    lVar17 = lVar17 + 0x1d0;
                  } while (uVar20 < pTVar8[uVar12].nb_sector);
                }
                local_b0 = (ulong)(uint)((int)local_b0 + local_c0);
                operator_delete__(local_98);
                bVar5 = true;
              }
              else {
                if (this_00 != (IDisk *)0x0) {
                  (*this_00->_vptr_IDisk[1])();
                }
                bVar5 = false;
                this_00 = (IDisk *)0x0;
              }
            }
            if (!bVar5) {
              return -2;
            }
            uVar23 = uVar23 + 1;
            uVar20 = local_b0;
          } while (uVar23 < this_00->nb_sides_);
        }
        uVar7 = (uint)local_b0;
        uVar12 = uVar12 + 1;
      } while (uVar12 != bVar1);
    }
    if (((uVar7 != 0) && (uVar12 = (ulong)(uVar7 + 0xf), uVar12 < size)) &&
       (*(long *)(buffer + (ulong)uVar7 + 6) == 0xa0d6f666e492d &&
        *(long *)(buffer + uVar7) == 0x492d74657366664f)) {
      this->extended_offset_ = true;
      bVar2 = this_00->nb_sides_;
      if ((ulong)bVar2 != 0) {
        uVar20 = 0;
        do {
          if (bVar1 != 0) {
            pTVar8 = this->side_[uVar20].tracks;
            uVar23 = 0;
            do {
              uVar22 = (ulong)pTVar8[uVar23].nb_sector;
              uVar12 = (ulong)((int)uVar12 + 2);
              if (uVar22 != 0) {
                pSVar11 = pTVar8[uVar23].sectors;
                lVar17 = 0;
                do {
                  *(undefined2 *)(pSVar11->mfm_chrn + lVar17 + -0x10) =
                       *(undefined2 *)(buffer + uVar12);
                  uVar12 = (ulong)((int)uVar12 + 2);
                  lVar17 = lVar17 + 0x1d0;
                } while (uVar22 * 0x1d0 - lVar17 != 0);
              }
              uVar23 = uVar23 + 1;
            } while (uVar23 != bVar1);
          }
          uVar20 = uVar20 + 1;
        } while (uVar20 != bVar2);
      }
    }
    if (this_00->nb_sides_ != '\0') {
      uVar12 = 0;
      do {
        if (this_00->side_[uVar12].nb_tracks != 0) {
          pSVar27 = this_00->side_ + uVar12;
          uVar20 = 0;
          do {
            iVar26 = (int)uVar12;
            iVar19 = (int)uVar20;
            uVar7 = GetNbRevolutions(this,iVar26,iVar19);
            pSVar27->tracks[uVar20].nb_revolutions = uVar7;
            uVar23 = (ulong)uVar7;
            puVar13 = (ulong *)operator_new__(uVar23 * 0x30 + 8);
            *puVar13 = uVar23;
            lVar17 = 0;
            do {
              puVar14 = (undefined8 *)((long)puVar13 + lVar17 + 0x18);
              *puVar14 = 0;
              puVar14[1] = 0;
              *(undefined8 *)((long)puVar13 + lVar17 + 0x28) = 0;
              lVar17 = lVar17 + 0x30;
            } while (uVar23 * 0x30 != lVar17);
            pMVar9 = pSVar27->tracks;
            pMVar9[uVar20].revolution = (Revolution *)(puVar13 + 1);
            if (pMVar9[uVar20].nb_revolutions != 0) {
              uVar7 = 0;
              do {
                FillTrackMfm(this,this_00,iVar26,iVar19,uVar7);
                local_58.list_sector_.
                super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_58.list_sector_.
                super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_58.list_sector_.
                super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                IDisk::GetTrackInfoForRev(this_00,iVar26,iVar19,&local_58,0);
                if (local_58.list_sector_.
                    super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(local_58.list_sector_.
                                  super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>.
                                  _M_impl.super__Vector_impl_data._M_start,
                                  (long)local_58.list_sector_.
                                        super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                  (long)local_58.list_sector_.
                                        super__Vector_base<IDisk::Sector,_std::allocator<IDisk::Sector>_>
                                        ._M_impl.super__Vector_impl_data._M_start);
                }
                uVar7 = uVar7 + 1;
              } while (uVar7 < pSVar27->tracks[uVar20].nb_revolutions);
            }
            uVar20 = uVar20 + 1;
          } while (uVar20 < pSVar27->nb_tracks);
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < this_00->nb_sides_);
    }
    if (this_00->nb_sides_ != '\0') {
      uVar12 = 0;
      do {
        pSVar27 = this_00->side_ + uVar12;
        uVar20 = (ulong)this_00->side_[uVar12].nb_tracks;
        if (uVar20 < 0x2a) {
          lVar17 = uVar20 << 5;
          do {
            uVar20 = uVar20 + 1;
            *(undefined4 *)((long)&pSVar27->tracks->nb_revolutions + lVar17) = 1;
            puVar14 = (undefined8 *)operator_new__(0x38);
            *puVar14 = 1;
            puVar14[3] = 0;
            puVar14[4] = 0;
            puVar14[5] = 0;
            *(undefined8 **)((long)&pSVar27->tracks->revolution + lVar17) = puVar14 + 1;
            *(undefined4 *)(puVar14 + 2) = 0x40000;
            pvVar15 = operator_new__(0x40000);
            **(undefined8 **)((long)&pSVar27->tracks->revolution + lVar17) = pvVar15;
            memset(pvVar15,0,0x40000);
            lVar17 = lVar17 + 0x20;
          } while ((int)uVar20 != 0x2a);
        }
        if (pSVar27->nb_tracks < 0x2a) {
          pSVar27->nb_tracks = 0x2a;
        }
        uVar12 = uVar12 + 1;
      } while (uVar12 < this_00->nb_sides_);
    }
    (*this_00->_vptr_IDisk[0x14])(this_00);
    *created_disk = this_00;
    iVar19 = 0;
  }
  return iVar19;
}

Assistant:

int FormatTypeEDSK::LoadDisk(const unsigned char* buffer, size_t size, IDisk*& created_disk,
                             ILoadingProgress* loading_progress)
{
   if (memcmp(buffer, "EXTENDED", 8) == 0)
   {
      IDisk* new_disk = new IDisk();

      // Extended
      // Name of creator : don't read
      // Number of tracks, and sides
      int m_NbTracks = buffer[0x30];
      new_disk->nb_sides_ = buffer[0x31];

      if (new_disk->nb_sides_ > 2)
      {
         // ERROR ! - TODO
         new_disk->nb_sides_ = 2;
      }

      // Track size table
      // Format disk on memory
      int i, j;
      unsigned int k;
      for (i = 0; i < new_disk->nb_sides_; i++)
      {
         unsigned int offset = 0x34 + i;
         side_[i].nb_tracks = m_NbTracks;
         new_disk->side_[i].nb_tracks = m_NbTracks;
         side_[i].tracks = new Track[m_NbTracks];
         new_disk->side_[i].tracks = new IDisk::MFMTrack[m_NbTracks < 42 ? 42 : m_NbTracks];
         memset(new_disk->side_[i].tracks, 0, (sizeof(IDisk::MFMTrack)) * m_NbTracks);
         memset(side_[i].tracks, 0, (sizeof(Track)) * m_NbTracks);
         for (j = 0; j < m_NbTracks; j++)
         {
            side_[i].tracks[j].track_size = (buffer[offset] << 8);
            //m_Side [i].Tracks[j].Formatted = ( header[offset] != 0);
            offset += new_disk->nb_sides_;
         }
      }
      unsigned int index_header = 0x100;

      for (j = 0; j < m_NbTracks; j++)
      {
         for (i = 0; i < new_disk->nb_sides_; i++)
         {
            // Formatted ?
            const unsigned char* header = buffer;

            if (side_[i].tracks[j].track_size > 0x100)
            {
               side_[i].tracks[j].formatted = true;

               header = &buffer[index_header];
               index_header += 0x100;
               //fread(header, 0x100, 1, file);

               if (memcmp(header, "Track-Info", 10) != 0)
               {
                  delete new_disk;
                  new_disk = nullptr;
                  return -2;
               }

               unsigned int size_to_remove_for_sector = 0x100;
               unsigned int offset_from_start = 0x18;
               //unsigned char* track_block = new unsigned char [m_Side[i].Tracks [j].TrackSize];
               //fread ( track_block, m_Side[i].Tracks [j].TrackSize-0x100, 1, file );
               // Track number
               unsigned int tn = header[0x10];
               if (tn != j)
               {
                  // bug...
                  //tn = m_NbTracks-1;
                  tn = j;
               }
               // Side number
               //i = header[0x11]; - Check this !
               if (i != header[0x11])
               {
               }
               unsigned char sectorSize_L = side_[i].tracks[tn].sz = header[0x14];
               side_[i].tracks[tn].sector_size = (0x80 << sectorSize_L);
               // Number of sector
               side_[i].tracks[tn].nb_sector = header[0x15];
               side_[i].tracks[tn].gap3 = header[0x16];
               side_[i].tracks[tn].gap3_filler = 0x4E; // header [0x17];
               side_[i].tracks[tn].sectors = new Sector[side_[i].tracks[tn].nb_sector];
               // Sector info
               unsigned int count = 0;
               unsigned int offset = 0;
               unsigned int total_size = 0;

               for (k = 0; k < side_[i].tracks[tn].nb_sector; k++)
               {
                  memset(&side_[i].tracks[tn].sectors[k], 0x00, sizeof(Sector));

                  // Get next 0x100 bytes ?
                  if ((count + 1) * 8 > 0x100 - offset_from_start)
                  {
                     // Get next 0x100 bytes
                     //memcpy ( &header[0x18], track_block, 0x100-0x18 );
                     //fread(header, 0x100, 1, file);
                     header = &buffer[index_header];
                     index_header += 0x100;

                     size_to_remove_for_sector += 0x100;
                     offset_from_start = 0;
                     count = 0;
                  }
                  side_[i].tracks[tn].sectors[k].track = header[offset_from_start + count * 8 + 00];
                  side_[i].tracks[tn].sectors[k].side = header[offset_from_start + count * 8 + 01];
                  side_[i].tracks[tn].sectors[k].sector_id = header[offset_from_start + count * 8 + 02];
                  side_[i].tracks[tn].sectors[k].sector_size = header[offset_from_start + count * 8 + 03];
                  side_[i].tracks[tn].sectors[k].fdc_status_1 = header[offset_from_start + count * 8 + 04];
                  side_[i].tracks[tn].sectors[k].fdc_status_2 = header[offset_from_start + count * 8 + 05];
                  side_[i].tracks[tn].sectors[k].actual_size = header[offset_from_start + count * 8 + 06];
                  side_[i].tracks[tn].sectors[k].actual_size += header[offset_from_start + count * 8 + 07] * 256;
                  total_size += side_[i].tracks[tn].sectors[k].actual_size;
                  count++;
               }

               unsigned char* track_block = NULL;

               if (total_size > side_[i].tracks[j].track_size - size_to_remove_for_sector && total_size > 0xFF00)
               {
                  // "total_size" should be at last a multiple of 0x100
                  if ((total_size & 0xFF) != 0)
                  {
                     total_size += (0x100 - (total_size & 0xFF));
                  }
                  // Set the totalsize as a
                  side_[i].tracks[j].track_size = total_size;
                  track_block = new unsigned char[side_[i].tracks[j].track_size];
                  memcpy(track_block, &buffer[index_header], side_[i].tracks[j].track_size);
                  index_header += side_[i].tracks[j].track_size;
               }
               else
               {
                  track_block = new unsigned char[side_[i].tracks[j].track_size - size_to_remove_for_sector];

                  memcpy(track_block, &buffer[index_header], side_[i].tracks[j].track_size - size_to_remove_for_sector);
                  index_header += (side_[i].tracks[j].track_size - size_to_remove_for_sector);
               }

               // Data
               if (tn == 0x13)
               {
                  int dbg = 1;
               }
               for (k = 0; k < side_[i].tracks[tn].nb_sector; k++)
               {
                  if (side_[i].tracks[tn].sectors[k].actual_size == 0)
                  {
                     side_[i].tracks[tn].sectors[k].data = NULL;
                  }
                  else
                  {
                     side_[i].tracks[tn].sectors[k].data = new unsigned char[side_[i].tracks[tn].sectors[k].actual_size
                     ];
                     memcpy(side_[i].tracks[tn].sectors[k].data, &track_block[offset],
                            side_[i].tracks[tn].sectors[k].actual_size);
                     offset += side_[i].tracks[tn].sectors[k].actual_size;
                  }
               }
               delete[]track_block;
            }
            else
            {
               header = &buffer[index_header];
               index_header += side_[i].tracks[j].track_size;
               side_[i].tracks[j].formatted = false;
            }
         }
      }

      // Extension ? Offset-Info ?
      if (index_header > 0 && index_header + 0x0F < size)
      {
         unsigned char sector_index_buffer[2];
         //if (memcmp(header, "Offset-Info\r\n", 0x0E) == 0)
         if (memcmp(&buffer[index_header], "Offset-Info\r\n", 0x0E) == 0)
         {
            index_header += 0x0F;
            extended_offset_ = true;
            // OFFSET EXT.
            // For each track
            for (int side = 0; side < new_disk->nb_sides_; side++)
            {
               for (i = 0; i < m_NbTracks; i++)
               {
                  // Read track length
                  //fread(sector_index_buffer, 1, 2, file);
                  memcpy(sector_index_buffer, &buffer[index_header], 2);
                  index_header += 2;
                  // For each sector
                  for (k = 0; k < side_[side].tracks[i].nb_sector; k++)
                  {
                     // Read offset
                     //fread(sector_index_buffer, 1, 2, file);
                     memcpy(sector_index_buffer, &buffer[index_header], 2);
                     index_header += 2;

                     side_[side].tracks[i].sectors[k].sector_index = sector_index_buffer[0] + (sector_index_buffer[1] << 8);
                  }
               }
            }
         }
         else
         {
            //fseek(file, -0x0F, SEEK_CUR);
         }
      }

      for (int side = 0; side < new_disk->nb_sides_; side++)
      {
         for (unsigned int track = 0; track < new_disk->side_[side].nb_tracks; track++)
         {
            // Fill tracks
            unsigned int nb_revolutions = GetNbRevolutions(side, track);
            //unsigned int size = FillTrack (  side, track, NULL, 1 );
            new_disk->side_[side].tracks[track].nb_revolutions = nb_revolutions;
            new_disk->side_[side].tracks[track].revolution = new IDisk::Revolution[nb_revolutions];

            for (unsigned int rev = 0; rev < new_disk->side_[side].tracks[track].nb_revolutions; rev++)
            {
               FillTrackMfm(new_disk, side, track, rev);

               IDisk::Track trk;
               LOG("TRACK ");
               LOG(i);
               LOGEOL
               new_disk->GetTrackInfoForRev(side, track, &trk);
               LOGEOL
            }
         }
      }

      // Complete to 42 tracks
      for (int side = 0; side < new_disk->nb_sides_; side++)
      {
         for (unsigned int track = new_disk->side_[side].nb_tracks; track < 42; track++)
         {
            new_disk->side_[side].tracks[track].nb_revolutions = 1; // Only one for DSK files
            new_disk->side_[side].tracks[track].revolution = new IDisk::Revolution[1];

            new_disk->side_[side].tracks[track].revolution[0].size = DEFAULT_TRACK_SIZE * 16;
            new_disk->side_[side].tracks[track].revolution[0].bitfield = new unsigned char[DEFAULT_TRACK_SIZE * 16];
            memset(new_disk->side_[side].tracks[track].revolution[0].bitfield, 0, DEFAULT_TRACK_SIZE * 16);
         }
         if (new_disk->side_[side].nb_tracks < 42)
            new_disk->side_[side].nb_tracks = 42;
      }

      new_disk->CreateTrackFromMultiRevolutions();

      created_disk = new_disk;

      return OK;
   }
   else
   {
      return FILE_ERROR;
   }
}